

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

cbtBroadphasePair * __thiscall
cbtSortedOverlappingPairCache::findPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          )

{
  uint uVar1;
  cbtOverlapFilterCallback *pcVar2;
  char cVar3;
  ulong uVar4;
  cbtBroadphaseProxy **ppcVar5;
  cbtBroadphaseProxy *pcVar6;
  
  pcVar2 = this->m_overlapFilterCallback;
  if (pcVar2 == (cbtOverlapFilterCallback *)0x0) {
    if ((proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) == 0) {
      return (cbtBroadphasePair *)0x0;
    }
    cVar3 = (proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) != 0;
  }
  else {
    cVar3 = (**(code **)(*(long *)pcVar2 + 0x10))(pcVar2,proxy0,proxy1);
  }
  if (cVar3 == '\0') {
    return (cbtBroadphasePair *)0x0;
  }
  pcVar6 = proxy1;
  if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
    pcVar6 = proxy0;
    proxy0 = proxy1;
  }
  uVar1 = (this->m_overlappingPairArray).m_size;
  if (0 < (int)uVar1) {
    ppcVar5 = &((this->m_overlappingPairArray).m_data)->m_pProxy1;
    uVar4 = 0;
    do {
      if ((((cbtBroadphasePair *)(ppcVar5 + -1))->m_pProxy0 == pcVar6) && (*ppcVar5 == proxy0))
      goto LAB_008c57c7;
      uVar4 = uVar4 + 1;
      ppcVar5 = ppcVar5 + 4;
    } while (uVar1 != uVar4);
  }
  uVar4 = (ulong)uVar1;
LAB_008c57c7:
  if ((int)uVar4 < (int)uVar1) {
    return (this->m_overlappingPairArray).m_data + (int)uVar4;
  }
  return (cbtBroadphasePair *)0x0;
}

Assistant:

cbtBroadphasePair* cbtSortedOverlappingPairCache::findPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0, proxy1))
		return 0;

	cbtBroadphasePair tmpPair(*proxy0, *proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//cbtAssert(it != m_overlappingPairSet.end());
		cbtBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}